

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void __thiscall deqp::RobustBufferAccessBehavior::Buffer::Bind(Buffer *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  Buffer *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  Bind((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_target);
  return;
}

Assistant:

void Buffer::Bind() const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_target);
}